

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O2

void __thiscall ddd::DaTrie<true,_true,_true>::push_block_(DaTrie<true,_true,_true> *this)

{
  pointer pBVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  bool bVar6;
  BlockLink local_40;
  
  uVar5 = (ulong)((long)(this->blocks_).
                        super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->blocks_).
                       super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 4;
  iVar4 = 0x100;
  while (bVar6 = iVar4 != 0, iVar4 = iVar4 + -1, bVar6) {
    local_40.next = 0;
    local_40.prev = 0;
    std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::emplace_back<ddd::Bc>
              (&this->bc_,(Bc *)&local_40);
  }
  iVar4 = 0x100;
  while (bVar6 = iVar4 != 0, iVar4 = iVar4 + -1, bVar6) {
    local_40._0_8_ = local_40._0_8_ & 0xffffffffffff0000;
    std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::emplace_back<ddd::NodeLink>
              (&this->node_links_,(NodeLink *)&local_40);
  }
  local_40.head = 0;
  local_40.num_emps = 0x100;
  local_40.next = 0;
  local_40.prev = 0;
  std::vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>::emplace_back<ddd::BlockLink>
            (&this->blocks_,&local_40);
  uVar3 = (uVar5 << 0x28) + 0x7fffffff00000000;
  uVar2 = uVar5 << 8 & 0xffffffff;
  while (uVar2 < (int)(uVar5 << 8) + 0x100) {
    *(uint *)((this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
              super__Vector_impl_data._M_start + uVar2) = (uint)(uVar2 + 1) & 0x7fffffff;
    pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar1[uVar2] = (Bc)((ulong)pBVar1[uVar2] & 0x80000000ffffffff | uVar3 & 0x7fffffff00000000);
    uVar3 = uVar3 + 0x100000000;
    uVar2 = uVar2 + 1;
  }
  push_block_(this,(uint32_t)uVar5,&this->blocks_);
  this->bc_emps_ = this->bc_emps_ + 0x100;
  return;
}

Assistant:

void push_block_() {
    auto block_pos = num_blocks();

    for (uint32_t i = 0; i < BLOCK_SIZE; ++i) {
      bc_.push_back(Bc{});
    }
    if (WithNLM) {
      for (uint32_t i = 0; i < BLOCK_SIZE; ++i) {
        node_links_.push_back(NodeLink{});
      }
    }
    blocks_.push_back(BlockType{});

    auto begin = block_pos * BLOCK_SIZE;
    auto end = begin + BLOCK_SIZE;

    for (auto i = begin; i < end; ++i) {
      set_next_(i, i + 1);
      set_prev_(i, i - 1);
    }

    push_block_(block_pos, blocks_);
    bc_emps_ += BLOCK_SIZE;
  }